

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluCofactors(word *pF,int nVars,int iVar,word *pCof0,word *pCof1)

{
  undefined8 uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  word *pwVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  word *pwVar10;
  long lVar11;
  word *pwVar12;
  int iVar13;
  
  uVar7 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar7 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x3fa,"void If_CluCofactors(word *, int, int, word *, word *)");
  }
  if (iVar < 6) {
    if (0 < (int)uVar7) {
      uVar3 = Truth6[iVar];
      uVar9 = 0;
      do {
        uVar4 = pF[uVar9] & ~uVar3;
        bVar2 = (byte)(1 << ((byte)iVar & 0x1f));
        pCof0[uVar9] = uVar4 << (bVar2 & 0x3f) | uVar4;
        uVar4 = pF[uVar9] & uVar3;
        pCof1[uVar9] = uVar4 >> (bVar2 & 0x3f) | uVar4;
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
  }
  else if (0 < (int)uVar7) {
    bVar2 = (byte)(iVar + -6);
    uVar8 = 1 << (bVar2 & 0x1f);
    iVar6 = 2 << (bVar2 & 0x1f);
    uVar3 = 1;
    if (1 < (int)uVar8) {
      uVar3 = (ulong)uVar8;
    }
    pwVar10 = pCof0 + (int)uVar8;
    pwVar5 = pF + (int)uVar8;
    pwVar12 = pCof1 + (int)uVar8;
    iVar13 = 0;
    do {
      if (iVar + -6 != 0x1f) {
        lVar11 = 0;
        do {
          uVar1 = *(undefined8 *)((long)pF + lVar11);
          *(undefined8 *)((long)pwVar10 + lVar11) = uVar1;
          *(undefined8 *)((long)pCof0 + lVar11) = uVar1;
          uVar1 = *(undefined8 *)((long)pwVar5 + lVar11);
          *(undefined8 *)((long)pwVar12 + lVar11) = uVar1;
          *(undefined8 *)((long)pCof1 + lVar11) = uVar1;
          lVar11 = lVar11 + 8;
        } while (uVar3 * 8 != lVar11);
      }
      iVar13 = iVar13 + iVar6;
      pwVar10 = pwVar10 + iVar6;
      pwVar5 = pwVar5 + iVar6;
      pwVar12 = pwVar12 + iVar6;
      pCof1 = pCof1 + iVar6;
      pCof0 = pCof0 + iVar6;
      pF = pF + iVar6;
    } while (iVar13 < (int)uVar7);
  }
  return;
}

Assistant:

void If_CluCofactors( word * pF, int nVars, int iVar, word * pCof0, word * pCof1 )
{
    int nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
        {
            pCof0[i] = (pF[i] & ~Truth6[iVar]) | ((pF[i] & ~Truth6[iVar]) << Shift);
            pCof1[i] = (pF[i] &  Truth6[iVar]) | ((pF[i] &  Truth6[iVar]) >> Shift);
        }
    }
    else
    {
        int i, k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pCof0[i] = pCof0[Step+i] = pF[i];
                pCof1[i] = pCof1[Step+i] = pF[Step+i];
            }
            pF    += 2*Step;
            pCof0 += 2*Step;
            pCof1 += 2*Step;
        }
    }
}